

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::StringOneofFieldGenerator::GenerateInlineAccessorDefinitions
          (StringOneofFieldGenerator *this,Printer *printer,bool is_inline)

{
  mapped_type *pmVar1;
  undefined7 in_register_00000011;
  char *pcVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  variables;
  key_type local_78;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_58,&(this->super_StringFieldGenerator).variables_._M_t);
  pcVar2 = "";
  if ((int)CONCAT71(in_register_00000011,is_inline) != 0) {
    pcVar2 = "inline ";
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"inline","");
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_58,&local_78);
  std::__cxx11::string::_M_replace((ulong)pmVar1,0,(char *)pmVar1->_M_string_length,(ulong)pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = 
  "$inline$const ::std::string& $classname$::$name$() const {\n  // @@protoc_insertion_point(field_get:$full_name$)\n  if (has_$name$()) {\n    return $oneof_prefix$$name$_.GetNoArena();\n  }\n  return *$default_variable$;\n}\n$inline$void $classname$::set_$name$(const ::std::string& value) {\n  // @@protoc_insertion_point(field_set:$full_name$)\n  if (!has_$name$()) {\n    clear_$oneof_name$();\n    set_has_$name$();\n    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n  }\n  $oneof_prefix$$name$_.SetNoArena($default_variable$, value);\n  // @@protoc_insertion_point(field_set:$full_name$)\n}\n#if LANG_CXX11\n$inline$void $classname$::set_$name$(::std::string&& value) {\n  // @@protoc_insertion_point(field_set:$full_name$)\n  if (!has_$name$()) {\n    clear_$oneof_name$();\n    set_has_$name$();\n    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n  }\n  $oneof_prefix$$name$_.SetNoArena(\n    $default_variable$, ::std::move(value));\n  // @@protoc_insertion_point(field_set_rvalue:$full_name$)\n}\n#endif\n$inline$void $classname$::set_$name$(const char* value) {\n  $null_check$  if (!has_$name$()) {\n    clear_$oneof_name$();\n    set_has_$name$();\n    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n  }\n  $oneof_prefix$$name$_.SetNoArena($default_variable$,\n      $string_piece$(value));\n  // @@protoc_insertion_point(field_set_char:$full_name$)\n}\n$inline$void $classname$::set_$name$(const $pointer_type$* value, size_t size) {\n  if (!has_$name$()) {\n    clear_$oneof_name$();\n    set_has_$name$();\n    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n  }\n  $oneof_prefix$$name$_.SetNoArena($default_variable$, $string_piece$(\n      reinterpret_cast<const char*>(value), size));\n  // @@protoc_insertion_point(field_set_pointer:$full_name$)\n}\n$inline$::std::string* $classname$::mutable_$name$() {\n  if (!has_$name$()) {\n    clear_$oneof_name$();\n    set_has_$name$();\n    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n  }\n  // @@protoc_insertion_point(field_mutable:$full_name$)\n  return $oneof_prefix..." /* TRUNCATED STRING LITERAL */
  ;
  if (*(char *)(*(long *)(*(long *)((this->super_StringFieldGenerator).descriptor_ + 0x30) + 0xa0) +
               0xa7) != '\0') {
    pcVar2 = 
    "$inline$const ::std::string& $classname$::$name$() const {\n  // @@protoc_insertion_point(field_get:$full_name$)\n  if (has_$name$()) {\n    return $oneof_prefix$$name$_.Get();\n  }\n  return *$default_variable$;\n}\n$inline$void $classname$::set_$name$(const ::std::string& value) {\n  if (!has_$name$()) {\n    clear_$oneof_name$();\n    set_has_$name$();\n    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n  }\n  $oneof_prefix$$name$_.Set($default_variable$, value,\n      GetArenaNoVirtual());\n  // @@protoc_insertion_point(field_set:$full_name$)\n}\n$inline$void $classname$::set_$name$(const char* value) {\n  $null_check$  if (!has_$name$()) {\n    clear_$oneof_name$();\n    set_has_$name$();\n    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n  }\n  $oneof_prefix$$name$_.Set($default_variable$,\n      $string_piece$(value), GetArenaNoVirtual());\n  // @@protoc_insertion_point(field_set_char:$full_name$)\n}\n$inline$void $classname$::set_$name$(const $pointer_type$* value,\n                             size_t size) {\n  if (!has_$name$()) {\n    clear_$oneof_name$();\n    set_has_$name$();\n    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n  }\n  $oneof_prefix$$name$_.Set($default_variable$, $string_piece$(\n      reinterpret_cast<const char*>(value), size),\n      GetArenaNoVirtual());\n  // @@protoc_insertion_point(field_set_pointer:$full_name$)\n}\n$inline$::std::string* $classname$::mutable_$name$() {\n  if (!has_$name$()) {\n    clear_$oneof_name$();\n    set_has_$name$();\n    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n  }\n  return $oneof_prefix$$name$_.Mutable($default_variable$,\n      GetArenaNoVirtual());\n  // @@protoc_insertion_point(field_mutable:$full_name$)\n}\n$inline$::std::string* $classname$::$release_name$() {\n  // @@protoc_insertion_point(field_release:$full_name$)\n  if (has_$name$()) {\n    clear_has_$oneof_name$();\n    return $oneof_prefix$$name$_.Release($default_variable$,\n        GetArenaNoVirtual());\n  } else {\n    return NULL;\n  }\n}\n$inline$::std::string* $classname$::unsa..." /* TRUNCATED STRING LITERAL */
    ;
  }
  io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_58,pcVar2);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_58);
  return;
}

Assistant:

void StringOneofFieldGenerator::
GenerateInlineAccessorDefinitions(io::Printer* printer,
                                  bool is_inline) const {
  std::map<string, string> variables(variables_);
  variables["inline"] = is_inline ? "inline " : "";
  if (SupportsArenas(descriptor_)) {
    printer->Print(
        variables,
        "$inline$const ::std::string& $classname$::$name$() const {\n"
        "  // @@protoc_insertion_point(field_get:$full_name$)\n"
        "  if (has_$name$()) {\n"
        "    return $oneof_prefix$$name$_.Get();\n"
        "  }\n"
        "  return *$default_variable$;\n"
        "}\n"
        "$inline$void $classname$::set_$name$(const ::std::string& value) {\n"
        "  if (!has_$name$()) {\n"
        "    clear_$oneof_name$();\n"
        "    set_has_$name$();\n"
        "    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n"
        "  }\n"
        "  $oneof_prefix$$name$_.Set($default_variable$, value,\n"
        "      GetArenaNoVirtual());\n"
        "  // @@protoc_insertion_point(field_set:$full_name$)\n"
        "}\n"
        "$inline$void $classname$::set_$name$(const char* value) {\n"
        "  $null_check$"
        "  if (!has_$name$()) {\n"
        "    clear_$oneof_name$();\n"
        "    set_has_$name$();\n"
        "    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n"
        "  }\n"
        "  $oneof_prefix$$name$_.Set($default_variable$,\n"
        "      $string_piece$(value), GetArenaNoVirtual());\n"
        "  // @@protoc_insertion_point(field_set_char:$full_name$)\n"
        "}\n"
        "$inline$"
        "void $classname$::set_$name$(const $pointer_type$* value,\n"
        "                             size_t size) {\n"
        "  if (!has_$name$()) {\n"
        "    clear_$oneof_name$();\n"
        "    set_has_$name$();\n"
        "    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n"
        "  }\n"
        "  $oneof_prefix$$name$_.Set($default_variable$, $string_piece$(\n"
        "      reinterpret_cast<const char*>(value), size),\n"
        "      GetArenaNoVirtual());\n"
        "  // @@protoc_insertion_point(field_set_pointer:$full_name$)\n"
        "}\n"
        "$inline$::std::string* $classname$::mutable_$name$() {\n"
        "  if (!has_$name$()) {\n"
        "    clear_$oneof_name$();\n"
        "    set_has_$name$();\n"
        "    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n"
        "  }\n"
        "  return $oneof_prefix$$name$_.Mutable($default_variable$,\n"
        "      GetArenaNoVirtual());\n"
        "  // @@protoc_insertion_point(field_mutable:$full_name$)\n"
        "}\n"
        "$inline$::std::string* $classname$::$release_name$() {\n"
        "  // @@protoc_insertion_point(field_release:$full_name$)\n"
        "  if (has_$name$()) {\n"
        "    clear_has_$oneof_name$();\n"
        "    return $oneof_prefix$$name$_.Release($default_variable$,\n"
        "        GetArenaNoVirtual());\n"
        "  } else {\n"
        "    return NULL;\n"
        "  }\n"
        "}\n"
        "$inline$::std::string* $classname$::unsafe_arena_release_$name$() {\n"
        "  // "
        "@@protoc_insertion_point(field_unsafe_arena_release:$full_name$)\n"
        "  GOOGLE_DCHECK(GetArenaNoVirtual() != NULL);\n"
        "  if (has_$name$()) {\n"
        "    clear_has_$oneof_name$();\n"
        "    return $oneof_prefix$$name$_.UnsafeArenaRelease(\n"
        "        $default_variable$, GetArenaNoVirtual());\n"
        "  } else {\n"
        "    return NULL;\n"
        "  }\n"
        "}\n"
        "$inline$void $classname$::set_allocated_$name$(::std::string* $name$) {\n"
        "  if (!has_$name$()) {\n"
        "    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n"
        "  }\n"
        "  clear_$oneof_name$();\n"
        "  if ($name$ != NULL) {\n"
        "    set_has_$name$();\n"
        "    $oneof_prefix$$name$_.SetAllocated($default_variable$, $name$,\n"
        "        GetArenaNoVirtual());\n"
        "  }\n"
        "  // @@protoc_insertion_point(field_set_allocated:$full_name$)\n"
        "}\n"
        "$inline$void $classname$::unsafe_arena_set_allocated_$name$("
        "::std::string* $name$) {\n"
        "  GOOGLE_DCHECK(GetArenaNoVirtual() != NULL);\n"
        "  if (!has_$name$()) {\n"
        "    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n"
        "  }\n"
        "  clear_$oneof_name$();\n"
        "  if ($name$) {\n"
        "    set_has_$name$();\n"
        "    $oneof_prefix$$name$_.UnsafeArenaSetAllocated($default_variable$, "
        "$name$, GetArenaNoVirtual());\n"
        "  }\n"
        "  // @@protoc_insertion_point(field_unsafe_arena_set_allocated:"
        "$full_name$)\n"
        "}\n");
  } else {
    // No-arena case.
    printer->Print(
        variables,
        "$inline$const ::std::string& $classname$::$name$() const {\n"
        "  // @@protoc_insertion_point(field_get:$full_name$)\n"
        "  if (has_$name$()) {\n"
        "    return $oneof_prefix$$name$_.GetNoArena();\n"
        "  }\n"
        "  return *$default_variable$;\n"
        "}\n"
        "$inline$void $classname$::set_$name$(const ::std::string& value) {\n"
        "  // @@protoc_insertion_point(field_set:$full_name$)\n"
        "  if (!has_$name$()) {\n"
        "    clear_$oneof_name$();\n"
        "    set_has_$name$();\n"
        "    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n"
        "  }\n"
        "  $oneof_prefix$$name$_.SetNoArena($default_variable$, value);\n"
        "  // @@protoc_insertion_point(field_set:$full_name$)\n"
        "}\n"
        "#if LANG_CXX11\n"
        "$inline$void $classname$::set_$name$(::std::string&& value) {\n"
        "  // @@protoc_insertion_point(field_set:$full_name$)\n"
        "  if (!has_$name$()) {\n"
        "    clear_$oneof_name$();\n"
        "    set_has_$name$();\n"
        "    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n"
        "  }\n"
        "  $oneof_prefix$$name$_.SetNoArena(\n"
        "    $default_variable$, ::std::move(value));\n"
        "  // @@protoc_insertion_point(field_set_rvalue:$full_name$)\n"
        "}\n"
        "#endif\n"
        "$inline$void $classname$::set_$name$(const char* value) {\n"
        "  $null_check$"
        "  if (!has_$name$()) {\n"
        "    clear_$oneof_name$();\n"
        "    set_has_$name$();\n"
        "    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n"
        "  }\n"
        "  $oneof_prefix$$name$_.SetNoArena($default_variable$,\n"
        "      $string_piece$(value));\n"
        "  // @@protoc_insertion_point(field_set_char:$full_name$)\n"
        "}\n"
        "$inline$"
        "void $classname$::set_$name$(const $pointer_type$* value, size_t "
        "size) {\n"
        "  if (!has_$name$()) {\n"
        "    clear_$oneof_name$();\n"
        "    set_has_$name$();\n"
        "    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n"
        "  }\n"
        "  $oneof_prefix$$name$_.SetNoArena($default_variable$, "
        "$string_piece$(\n"
        "      reinterpret_cast<const char*>(value), size));\n"
        "  // @@protoc_insertion_point(field_set_pointer:$full_name$)\n"
        "}\n"
        "$inline$::std::string* $classname$::mutable_$name$() {\n"
        "  if (!has_$name$()) {\n"
        "    clear_$oneof_name$();\n"
        "    set_has_$name$();\n"
        "    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n"
        "  }\n"
        "  // @@protoc_insertion_point(field_mutable:$full_name$)\n"
        "  return $oneof_prefix$$name$_.MutableNoArena($default_variable$);\n"
        "}\n"
        "$inline$::std::string* $classname$::$release_name$() {\n"
        "  // @@protoc_insertion_point(field_release:$full_name$)\n"
        "  if (has_$name$()) {\n"
        "    clear_has_$oneof_name$();\n"
        "    return $oneof_prefix$$name$_.ReleaseNoArena($default_variable$);\n"
        "  } else {\n"
        "    return NULL;\n"
        "  }\n"
        "}\n"
        "$inline$void $classname$::set_allocated_$name$(::std::string* $name$) {\n"
        "  if (!has_$name$()) {\n"
        "    $oneof_prefix$$name$_.UnsafeSetDefault($default_variable$);\n"
        "  }\n"
        "  clear_$oneof_name$();\n"
        "  if ($name$ != NULL) {\n"
        "    set_has_$name$();\n"
        "    $oneof_prefix$$name$_.SetAllocatedNoArena($default_variable$,\n"
        "        $name$);\n"
        "  }\n"
        "  // @@protoc_insertion_point(field_set_allocated:$full_name$)\n"
        "}\n");
  }
}